

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_get_unique_default(char *unique_expr,lyd_node *list,char **dflt)

{
  ly_ctx *ctx;
  lys_node **pplVar1;
  lys_node *plVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  lys_ext_instance *plVar6;
  ly_set *set;
  ly_set *set_00;
  lys_ext_instance *plVar7;
  uint uVar8;
  lys_node *node_00;
  uint uVar9;
  ulong uVar10;
  lys_node *local_50;
  lyd_node *node;
  int_log_opts local_3c;
  lys_node *plStack_38;
  int_log_opts prev_ilo;
  
  if ((unique_expr == (char *)0x0) || (dflt == (char **)0x0)) {
    __assert_fail("unique_expr && list && dflt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1894,
                  "int lyd_get_unique_default(const char *, struct lyd_node *, const char **)");
  }
  ctx = list->schema->module->ctx;
  *dflt = (char *)0x0;
  iVar4 = resolve_descendant_schema_nodeid
                    (unique_expr,list->schema->child,4,1,&stack0xffffffffffffffc8);
  plVar2 = plStack_38;
  if (iVar4 == 0 && plStack_38 != (lys_node *)0x0) {
    if (plStack_38[1].prev == (lys_node *)0x0) {
      if (((plStack_38->flags & 0x40) == 0) &&
         (plVar6 = (lys_ext_instance *)plStack_38[1].ext, plVar6 != (lys_ext_instance *)0x0)) {
        plVar7 = (lys_ext_instance *)*dflt;
        do {
          if (plVar7 != (lys_ext_instance *)0x0) break;
          plVar7 = *(lys_ext_instance **)((long)(plVar6 + 1) + 0x38);
          *dflt = (char *)plVar7;
          plVar6 = *(lys_ext_instance **)((long)(plVar6 + 1) + 8);
        } while (plVar6 != (lys_ext_instance *)0x0);
      }
    }
    else {
      *dflt = (char *)plStack_38[1].prev;
    }
    if (*dflt == (char *)0x0) {
      iVar4 = 0;
    }
    else {
      set = ly_set_new();
      node_00 = plVar2;
      while (plStack_38 = lys_parent(node_00), plStack_38 != list->schema) {
        if ((plStack_38->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE|LYS_CONTAINER)) == LYS_UNKNOWN) {
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                 ,0x18b1);
          ly_set_free(set);
          goto LAB_0016ebb5;
        }
        ly_set_add(set,plStack_38,1);
        node_00 = plStack_38;
      }
      node = (lyd_node *)plVar2;
      uVar10 = 0;
      ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,&local_3c,(ly_err_item **)0x0);
      uVar5 = set->number;
      if (uVar5 != 0) {
        do {
          pplVar1 = (set->set).s;
          uVar9 = (uint)uVar10;
          plVar2 = pplVar1[uVar10];
          uVar8 = uVar9;
          if (plVar2->nodetype == LYS_CHOICE) {
            if ((lys_node *)list == (lys_node *)0x0) {
              list = (lyd_node *)0x0;
            }
            else {
              uVar8 = uVar9 + 1;
              plStack_38 = (lys_node *)node;
              if ((((uVar8 == uVar5) ||
                   (plStack_38 = pplVar1[uVar8], plStack_38->nodetype != LYS_CASE)) ||
                  (uVar5 <= uVar9 + 2)) || (pplVar1[uVar9 + 2]->nodetype != LYS_CHOICE)) {
                local_50 = ((lys_node *)list)->parent;
                iVar4 = lyv_multicases((lyd_node *)0x0,plStack_38,(lyd_node **)&local_50,0,
                                       (lyd_node *)0x0);
                uVar8 = uVar9;
                plVar2 = plStack_38;
                if (iVar4 != 0) goto LAB_0016ed89;
              }
            }
          }
          else if (plVar2->nodetype == LYS_CONTAINER) {
            plStack_38 = plVar2;
            if ((lys_node *)list == (lys_node *)0x0) {
              list = (lyd_node *)0x0;
LAB_0016ed2a:
              lVar3._0_2_ = plStack_38[1].flags;
              lVar3._2_1_ = plStack_38[1].ext_size;
              lVar3._3_1_ = plStack_38[1].iffeature_size;
              lVar3._4_1_ = plStack_38[1].padding[0];
              lVar3._5_1_ = plStack_38[1].padding[1];
              lVar3._6_1_ = plStack_38[1].padding[2];
              lVar3._7_1_ = plStack_38[1].padding[3];
              plVar2 = plStack_38;
              if (lVar3 == 0) goto LAB_0016ed38;
            }
            else {
              set_00 = lyd_find_path(list,plVar2->name);
              if ((set_00 != (ly_set *)0x0) && (set_00->number < 2)) {
                if (set_00->number == 0) {
                  list = (lyd_node *)0x0;
                }
                else {
                  list = (lyd_node *)*(set_00->set).s;
                }
                free((set_00->set).s);
                free(set_00);
                goto LAB_0016ed2a;
              }
              ly_set_free(set_00);
            }
LAB_0016ed89:
            *dflt = (char *)0x0;
            break;
          }
LAB_0016ed38:
          plStack_38 = plVar2;
          uVar10 = (ulong)(uVar8 + 1);
          uVar5 = set->number;
        } while (uVar8 + 1 < uVar5);
      }
      iVar4 = 0;
      ly_ilo_restore((ly_ctx *)0x0,local_3c,(ly_err_item *)0x0,0);
      ly_set_free(set);
    }
  }
  else {
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
           ,0x1899);
LAB_0016ebb5:
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int
lyd_get_unique_default(const char* unique_expr, struct lyd_node *list, const char **dflt)
{
    struct ly_ctx *ctx = list->schema->module->ctx;
    const struct lys_node *parent;
    const struct lys_node_leaf *sleaf = NULL;
    struct lys_tpdf *tpdf;
    struct lyd_node *last, *node;
    struct ly_set *s, *r;
    unsigned int i;
    enum int_log_opts prev_ilo;

    assert(unique_expr && list && dflt);
    *dflt = NULL;

    if (resolve_descendant_schema_nodeid(unique_expr, list->schema->child, LYS_LEAF, 1, &parent) || !parent) {
        /* error, but unique expression was checked when the schema was parsed so this should not happened */
        LOGINT(ctx);
        return -1;
    }

    sleaf = (struct lys_node_leaf *)parent;
    if (sleaf->dflt) {
        /* leaf has a default value */
        *dflt = sleaf->dflt;
    } else if (!(sleaf->flags & LYS_MAND_TRUE)) {
        /* get the default value from the type */
        for (tpdf = sleaf->type.der; tpdf && !(*dflt); tpdf = tpdf->type.der) {
            *dflt = tpdf->dflt;
        }
    }

    if (!(*dflt)) {
        return 0;
    }

    /* it has default value, but check if it can appear in the data tree under the list */
    s = ly_set_new();
    for (parent = lys_parent((struct lys_node *)sleaf); parent != list->schema; parent = lys_parent(parent)) {
        if (!(parent->nodetype & (LYS_CONTAINER | LYS_CASE | LYS_CHOICE | LYS_USES))) {
            /* This should be already detected when parsing schema */
            LOGINT(ctx);
            ly_set_free(s);
            return -1;
        }
        ly_set_add(s, (void *)parent, LY_SET_OPT_USEASLIST);
    }

    ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
    for (i = 0, last = list; i < s->number; i++) {
        parent = s->set.s[i]; /* shortcut */

        switch (parent->nodetype) {
        case LYS_CONTAINER:
            if (last) {
                /* find instance in the data */
                r = lyd_find_path(last, parent->name);
                if (!r || r->number > 1) {
                    ly_set_free(r);
                    *dflt = NULL;
                    goto end;
                }
                if (r->number) {
                    last = r->set.d[0];
                } else {
                    last = NULL;
                }
                ly_set_free(r);
            }
            if (((struct lys_node_container *)parent)->presence) {
                /* not-instantiated presence container on path */
                *dflt = NULL;
                goto end;
            }
            break;
        case LYS_CHOICE :
            /* check presence of another case */
            if (!last) {
                continue;
            }

            /* remember the case to be searched in choice by lyv_multicases() */
            if (i + 1 == s->number) {
                parent = (struct lys_node *)sleaf;
            } else if (s->set.s[i + 1]->nodetype == LYS_CASE && (i + 2 < s->number) &&
                    s->set.s[i + 2]->nodetype == LYS_CHOICE) {
                /* nested choices are covered by lyv_multicases, we just have to pass
                 * the lowest choice */
                i++;
                continue;
            } else {
                parent = s->set.s[i + 1];
            }
            node = last->child;
            if (lyv_multicases(NULL, (struct lys_node *)parent, &node, 0, NULL)) {
                /* another case is present */
                *dflt = NULL;
                goto end;
            }
            break;
        default:
            /* LYS_CASE, LYS_USES */
            continue;
        }
    }

end:
    ly_ilo_restore(NULL, prev_ilo, NULL, 0);
    ly_set_free(s);
    return 0;
}